

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seekforintruder.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  byte bVar2;
  pointer pcVar3;
  size_t sVar4;
  size_t __n;
  string *psVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  address *a_1;
  istream *piVar9;
  long *plVar10;
  long lVar11;
  pointer paVar12;
  ostream *poVar13;
  long *plVar14;
  ulong *puVar15;
  address *a_2;
  ulong uVar16;
  pointer pbVar17;
  pointer pbVar18;
  pointer __x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  size_type *psVar20;
  string *psVar21;
  long lVar22;
  string addr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addrs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> a;
  string oct;
  vector<sfi::data::address,_std::allocator<sfi::data::address>_> counts;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  octets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addrsFin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string addr_1;
  ifstream stream;
  value_type local_598;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_578;
  string *local_560;
  string local_558;
  long *local_538;
  long local_530;
  long local_528;
  long lStack_520;
  value_type local_518;
  vector<sfi::data::address,_std::allocator<sfi::data::address>_> local_4f8;
  undefined1 *local_4d8;
  ulong local_4d0;
  undefined1 local_4c8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  long *local_498;
  long local_490;
  long local_488;
  long lStack_480;
  long *local_478;
  long local_470;
  long local_468;
  long lStack_460;
  long *local_458;
  long local_450;
  long local_448;
  long lStack_440;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  undefined1 *local_418;
  long local_410;
  undefined1 local_408 [16];
  undefined1 *local_3f8 [2];
  undefined1 local_3e8 [16];
  string local_3d8;
  address local_3b8 [3];
  ios_base local_340 [264];
  long local_238 [65];
  
  std::ifstream::ifstream(local_238,argv[1],_S_in);
  local_4d8 = local_4c8;
  local_4d0 = 0;
  local_4c8[0] = 0;
  local_578.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_578.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_578.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_4f8.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4f8.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f8.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    do {
      paVar19 = &local_3b8[0].addr.field_2;
      cVar6 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_4d8,cVar6);
      pbVar18 = local_578.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) {
        if (local_578.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_578.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pbVar17 = local_578.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
            pcVar3 = (pbVar17->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_558,pcVar3,pcVar3 + pbVar17->_M_string_length);
            local_4b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_4b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_4b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)local_3b8,(string *)&local_558,_S_in);
            local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
            local_518._M_string_length = 0;
            local_518.field_2._M_local_buf[0] = '\0';
            while (piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                      ((istream *)local_3b8,(string *)&local_518,'.'),
                  ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_4b8,&local_518);
            }
            uVar16 = (long)local_4b8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_4b8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
            if (uVar16 < 5) {
              if ((uVar16 == 4) || (uVar16 == 1)) {
                local_538 = &local_528;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_538,local_558._M_dataplus._M_p,
                           local_558._M_dataplus._M_p + local_558._M_string_length);
              }
              else {
                local_538 = &local_528;
                local_528 = CONCAT62(local_528._2_6_,0x30);
                local_530 = 1;
              }
            }
            else {
              local_3f8[0] = local_3e8;
              pcVar3 = ((local_4b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_3f8,pcVar3,
                         pcVar3 + (local_4b8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
              std::__cxx11::string::append((char *)local_3f8);
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)local_3f8,
                                           (ulong)local_4b8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  _M_dataplus._M_p);
              local_498 = &local_488;
              plVar14 = plVar10 + 2;
              if ((long *)*plVar10 == plVar14) {
                local_488 = *plVar14;
                lStack_480 = plVar10[3];
              }
              else {
                local_488 = *plVar14;
                local_498 = (long *)*plVar10;
              }
              local_490 = plVar10[1];
              *plVar10 = (long)plVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_498);
              local_478 = &local_468;
              plVar14 = plVar10 + 2;
              if ((long *)*plVar10 == plVar14) {
                local_468 = *plVar14;
                lStack_460 = plVar10[3];
              }
              else {
                local_468 = *plVar14;
                local_478 = (long *)*plVar10;
              }
              local_470 = plVar10[1];
              *plVar10 = (long)plVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_478,
                                           (ulong)local_4b8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                                  _M_dataplus._M_p);
              local_458 = &local_448;
              plVar14 = plVar10 + 2;
              if ((long *)*plVar10 == plVar14) {
                local_448 = *plVar14;
                lStack_440 = plVar10[3];
              }
              else {
                local_448 = *plVar14;
                local_458 = (long *)*plVar10;
              }
              local_450 = plVar10[1];
              *plVar10 = (long)plVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_458);
              local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
              puVar15 = (ulong *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar15) {
                local_598.field_2._M_allocated_capacity = *puVar15;
                local_598.field_2._8_8_ = plVar10[3];
              }
              else {
                local_598.field_2._M_allocated_capacity = *puVar15;
                local_598._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_598._M_string_length = plVar10[1];
              *plVar10 = (long)puVar15;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_598,
                                           (ulong)local_4b8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].
                                                  _M_dataplus._M_p);
              local_538 = &local_528;
              plVar14 = plVar10 + 2;
              if ((long *)*plVar10 == plVar14) {
                local_528 = *plVar14;
                lStack_520 = plVar10[3];
              }
              else {
                local_528 = *plVar14;
                local_538 = (long *)*plVar10;
              }
              local_530 = plVar10[1];
              *plVar10 = (long)plVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_598._M_dataplus._M_p != &local_598.field_2) {
                operator_delete(local_598._M_dataplus._M_p);
              }
              if (local_458 != &local_448) {
                operator_delete(local_458);
              }
              if (local_478 != &local_468) {
                operator_delete(local_478);
              }
              if (local_498 != &local_488) {
                operator_delete(local_498);
              }
              if (local_3f8[0] != local_3e8) {
                operator_delete(local_3f8[0]);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_518._M_dataplus._M_p != &local_518.field_2) {
              operator_delete(local_518._M_dataplus._M_p);
            }
            std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
            std::ios_base::~ios_base(local_340);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_4b8);
            std::__cxx11::string::operator=((string *)&local_558,(string *)&local_538);
            if (local_538 != &local_528) {
              operator_delete(local_538);
            }
            lVar11 = std::__cxx11::string::find((char)&local_558,0x2e);
            if (lVar11 == -1) {
              iVar8 = sfi::logic::getBase(&local_558);
              if ((iVar8 == 2) && (local_558._M_string_length < 0x20)) {
                std::__cxx11::string::insert
                          ((ulong)&local_558,0,' ' - (char)local_558._M_string_length);
              }
              local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3d8,local_558._M_dataplus._M_p,
                         local_558._M_dataplus._M_p + local_558._M_string_length);
              sfi::logic::toDot(&local_3b8[0].addr,&local_3d8,iVar8);
              std::__cxx11::string::operator=((string *)&local_558,(string *)local_3b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8[0].addr._M_dataplus._M_p != &local_3b8[0].addr.field_2) {
                operator_delete(local_3b8[0].addr._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                operator_delete(local_3d8._M_dataplus._M_p);
              }
              sfi::logic::dotToDotDec(&local_3b8[0].addr,&local_558,iVar8);
            }
            else {
              iVar8 = sfi::logic::getBase(&local_558);
              sfi::logic::dotToDotDec(&local_3b8[0].addr,&local_558,iVar8);
            }
            std::__cxx11::string::operator=((string *)&local_558,(string *)local_3b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8[0].addr._M_dataplus._M_p != &local_3b8[0].addr.field_2) {
              operator_delete(local_3b8[0].addr._M_dataplus._M_p);
            }
            bVar7 = sfi::logic::validateAddr(&local_558);
            if (bVar7) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_438,&local_558);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_558._M_dataplus._M_p != &local_558.field_2) {
              operator_delete(local_558._M_dataplus._M_p);
            }
            pbVar17 = pbVar17 + 1;
          } while (pbVar17 != pbVar18);
        }
        if (local_438.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_438.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_560 = local_438.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          pbVar18 = local_438.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar21 = local_438.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          do {
            bVar7 = sfi::logic::validateAddr(pbVar18);
            paVar12 = local_4f8.
                      super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (bVar7) {
              iVar8 = -1;
              if ((long)local_4f8.
                        super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_4f8.
                        super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
                        _M_impl.super__Vector_impl_data._M_start != 0) {
                lVar22 = ((long)local_4f8.
                                super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_4f8.
                                super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x3333333333333333;
                pcVar3 = (pbVar18->_M_dataplus)._M_p;
                sVar4 = pbVar18->_M_string_length;
                psVar20 = &((local_4f8.
                             super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>
                             ._M_impl.super__Vector_impl_data._M_start)->addr)._M_string_length;
                lVar11 = 0;
                do {
                  __n = *psVar20;
                  if ((__n == sVar4) &&
                     ((__n == 0 ||
                      (iVar8 = bcmp((((value_type *)(psVar20 + -1))->_M_dataplus)._M_p,pcVar3,__n),
                      iVar8 == 0)))) {
                    iVar8 = (int)lVar11;
                    psVar21 = local_560;
                    goto LAB_00103ee7;
                  }
                  lVar11 = lVar11 + 1;
                  psVar20 = psVar20 + 5;
                } while (lVar22 + (ulong)(lVar22 == 0) != lVar11);
                iVar8 = -1;
                psVar21 = local_560;
              }
LAB_00103ee7:
              paVar19 = &local_3b8[0].addr.field_2;
              if (iVar8 == -1) {
                local_418 = local_408;
                pcVar3 = (pbVar18->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_418,pcVar3,pcVar3 + pbVar18->_M_string_length);
                local_3b8[0].addr._M_dataplus._M_p = (pointer)paVar19;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_3b8,local_418,local_418 + local_410);
                local_3b8[0].count = 1;
                std::vector<sfi::data::address,_std::allocator<sfi::data::address>_>::
                emplace_back<sfi::data::address>(&local_4f8,local_3b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8[0].addr._M_dataplus._M_p != paVar19) {
                  operator_delete(local_3b8[0].addr._M_dataplus._M_p);
                }
                if (local_418 != local_408) {
                  operator_delete(local_418);
                }
              }
              else {
                paVar12[iVar8].count = paVar12[iVar8].count + 1;
              }
            }
            pbVar18 = pbVar18 + 1;
          } while (pbVar18 != psVar21);
        }
        pbVar17 = local_578.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pbVar18 = local_578.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar8 = 0;
        for (paVar12 = local_4f8.
                       super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            paVar12 !=
            local_4f8.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
            _M_impl.super__Vector_impl_data._M_finish; paVar12 = paVar12 + 1) {
          if (iVar8 < paVar12->count) {
            iVar8 = paVar12->count;
          }
        }
        psVar21 = local_578.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_578.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_578.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          do {
            pcVar3 = (psVar21->_M_dataplus)._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != &psVar21->field_2) {
              operator_delete(pcVar3);
            }
            psVar21 = psVar21 + 1;
          } while (psVar21 != pbVar17);
          local_578.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar18;
        }
        paVar12 = local_4f8.
                  super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (local_4f8.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_4f8.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          __x = local_4f8.
                super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>._M_impl.
                super__Vector_impl_data._M_start;
          do {
            if (__x->count == iVar8) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_578,&__x->addr);
            }
            __x = __x + 1;
          } while (__x != paVar12);
        }
        pbVar17 = local_578.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pbVar18 = local_578.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar21 = local_578.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar5 = local_578.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_578.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_578.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          uVar16 = (long)local_578.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_578.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          lVar11 = 0x3f;
          if (uVar16 != 0) {
            for (; uVar16 >> lVar11 == 0; lVar11 = lVar11 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_578.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_578.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pbVar18,pbVar17);
          psVar21 = local_578.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar5 = local_578.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pbVar18 = local_578.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
            psVar21 !=
            local_578.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; psVar21 = psVar21 + 1) {
          local_578.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = psVar5;
          bVar7 = sfi::logic::validateAddr(psVar21);
          if (bVar7) {
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(psVar21->_M_dataplus)._M_p,
                                 psVar21->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          }
          psVar5 = local_578.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_578.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar18;
        }
        local_578.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar5;
        std::vector<sfi::data::address,_std::allocator<sfi::data::address>_>::~vector(&local_4f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_438);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_578);
        if (local_4d8 != local_4c8) {
          operator_delete(local_4d8);
        }
        std::ifstream::~ifstream(local_238);
        return 0;
      }
    } while (200 < local_4d0 - 100);
    local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
    local_598._M_string_length = 0;
    local_598.field_2._M_allocated_capacity =
         local_598.field_2._M_allocated_capacity & 0xffffffffffffff00;
    iVar8 = std::__cxx11::string::find((char *)&local_4d8,0x106058,0);
    cVar6 = (char)&local_598;
    if (iVar8 == -1) {
      if (local_4d0 != 0) {
        uVar16 = 0;
        do {
          if (local_4d8[uVar16] == '.' || (byte)(local_4d8[uVar16] - 0x30) < 10) {
            std::__cxx11::string::push_back(cVar6);
          }
          else {
            if ((char *)0x3 < local_598._M_string_length) {
              local_3b8[0].addr._M_dataplus._M_p = (pointer)paVar19;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_3b8,local_598._M_dataplus._M_p,
                         (char *)(local_598._M_string_length + (long)local_598._M_dataplus._M_p));
              if (*local_3b8[0].addr._M_dataplus._M_p == '.') {
                std::__cxx11::string::substr((ulong)&local_518,(ulong)local_3b8);
                std::__cxx11::string::operator=((string *)local_3b8,(string *)&local_518);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_518._M_dataplus._M_p != &local_518.field_2) {
                  operator_delete(local_518._M_dataplus._M_p);
                }
              }
              if (local_3b8[0].addr._M_dataplus._M_p[local_3b8[0].addr._M_string_length - 1] == '.')
              {
                std::__cxx11::string::substr((ulong)&local_518,(ulong)local_3b8);
                std::__cxx11::string::operator=((string *)local_3b8,(string *)&local_518);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_518._M_dataplus._M_p != &local_518.field_2) {
                  operator_delete(local_518._M_dataplus._M_p);
                }
              }
              iVar8 = std::__cxx11::string::find((char *)local_3b8,0x10604c,0);
              if (iVar8 == -1) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_578,&local_3b8[0].addr);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8[0].addr._M_dataplus._M_p != paVar19) {
                operator_delete(local_3b8[0].addr._M_dataplus._M_p);
              }
            }
            std::__cxx11::string::_M_replace
                      ((ulong)&local_598,0,(char *)local_598._M_string_length,0x106021);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < local_4d0);
      }
    }
    else {
      uVar16 = (ulong)iVar8;
      if (uVar16 < local_4d0) {
        bVar7 = true;
        do {
          bVar2 = local_4d8[uVar16];
          if (((bVar2 - 0x41 < 0x26) && ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0)
              ) || (bVar2 == 0x78 || (byte)(bVar2 - 0x30) < 10)) {
            std::__cxx11::string::push_back(cVar6);
          }
          else if (bVar2 == 0x2e) {
            std::__cxx11::string::push_back(cVar6);
            bVar7 = false;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < local_4d0);
        if (!bVar7) {
          iVar8 = (int)local_598._M_string_length + 5;
          do {
            iVar1 = iVar8 + -6;
            iVar8 = iVar8 + -1;
          } while (local_598._M_dataplus._M_p[iVar1] != '.');
          std::__cxx11::string::substr((ulong)local_3b8,(ulong)&local_598);
          std::__cxx11::string::operator=((string *)&local_598,(string *)local_3b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8[0].addr._M_dataplus._M_p != &local_3b8[0].addr.field_2) {
            operator_delete(local_3b8[0].addr._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_578,&local_598);
          goto LAB_0010381c;
        }
      }
      std::__cxx11::string::substr((ulong)local_3b8,(ulong)&local_598);
      std::__cxx11::string::operator=((string *)&local_598,(string *)local_3b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8[0].addr._M_dataplus._M_p != &local_3b8[0].addr.field_2) {
        operator_delete(local_3b8[0].addr._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_578,&local_598);
    }
LAB_0010381c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      operator_delete(local_598._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);
//    ifstream stream("/home/arkezar/intruder");
    string line;
    vector<string> addrs;
    vector<string> addrsFin;
    vector<sfi::data::address> counts;
//    int lineNo = 0;
    while (getline(stream, line)) {
//        lineNo+=1;
//        if(lineNo<=1200) {
            if (line.length() >= 100 && line.length() <= 300)
                sfi::logic::searchAddr(line, addrs);
//        } else {
//            return 0;
//        }
    }

    for (auto a : addrs) {
        a = sfi::logic::octetValidation(a);
        if(a.find('.')!=-1){
            a = sfi::logic::dotToDotDec(a,sfi::logic::getBase(a));
        } else {
            int base = sfi::logic::getBase(a);
            if(base == 2 && a.length() < 32) {
                a.insert(0, 32 - a.length(), '0');
            }
            a = sfi::logic::toDot(a,base);
            a = sfi::logic::dotToDotDec(a,base);
        }

        if(sfi::logic::validateAddr(a))
            addrsFin.push_back(a);
    }

    for(const auto& a : addrsFin){
        if(sfi::logic::validateAddr(a)) {
            int el = sfi::logic::elExists(counts, a);
            if (el != -1) {
                counts[el].increaseCount();
            } else {
                counts.push_back(sfi::data::address(a, 1));
            }
        }
    }

    int maxOcc = 0;
    for (const sfi::data::address& a : counts) {
        if(a.count > maxOcc)
            maxOcc = a.count;
    }

    addrs.clear();

    for (const sfi::data::address& a : counts) {
        if(a.count == maxOcc)
            addrs.push_back(a.addr);
    }

    std::sort(addrs.begin(),addrs.end());

    for(const string& a : addrs)
        if(sfi::logic::validateAddr(a))
            cout << a << " ";

    return 0;
}